

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

Wrench * __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::fromUsedRepresentationToBodyFixed
          (Wrench *__return_storage_ptr__,KinDynComputationsPrivateAttributes *this,
          Wrench *wrenchInUsedRepresentation,Transform *inertial_X_link)

{
  Wrench WStack_78;
  
  if (this->m_frameVelRepr == MIXED_REPRESENTATION) {
    iDynTree::Transform::getRotation();
    iDynTree::Rotation::inverse();
    iDynTree::Rotation::operator*((Rotation *)__return_storage_ptr__,&WStack_78);
  }
  else if (this->m_frameVelRepr == BODY_FIXED_REPRESENTATION) {
    iDynTree::Wrench::Wrench(__return_storage_ptr__,wrenchInUsedRepresentation);
  }
  else {
    iDynTree::Transform::inverse();
    iDynTree::Transform::operator*((Transform *)__return_storage_ptr__,&WStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

Wrench KinDynComputations::KinDynComputationsPrivateAttributes::fromUsedRepresentationToBodyFixed(const Wrench & wrenchInUsedRepresentation,
                                                                                                  const Transform & inertial_X_link)
{
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return Wrench(wrenchInUsedRepresentation);
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        return (inertial_X_link.getRotation().inverse())*wrenchInUsedRepresentation;
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        return inertial_X_link.inverse()*wrenchInUsedRepresentation;
    }

    assert(false);
    return Wrench::Zero();
}